

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qp2passes.hpp
# Opt level: O0

void __thiscall mp::QP2Passes::InitPass1(QP2Passes *this)

{
  QP2Passes *in_RDI;
  bool in_stack_00000077;
  size_type in_stack_00000078;
  vector<bool,_std::allocator<bool>_> *in_stack_00000080;
  QP2PassVisitor *in_stack_fffffffffffffff0;
  
  QP2PassVisitor::InitPass1(in_stack_fffffffffffffff0);
  GetTopExpr(in_RDI);
  BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
  ::num_args((BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
              *)0x700361);
  std::vector<bool,_std::allocator<bool>_>::resize
            (in_stack_00000080,in_stack_00000078,in_stack_00000077);
  in_RDI->n_qp_terms_ = 0;
  return;
}

Assistant:

void QP2Passes::InitPass1() {
  visitor_.InitPass1();
  is_term_qp_.resize(GetTopExpr().num_args());
  n_qp_terms_ = 0;
}